

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O0

void __thiscall
Assimp::MD5::MD5CameraParser::MD5CameraParser(MD5CameraParser *this,SectionList *mSections)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  Logger *pLVar4;
  reference pSVar5;
  reference out;
  char *pcVar6;
  ai_real aVar7;
  CameraAnimFrameDesc *cur;
  float fStack_b0;
  float local_ac;
  float fStack_a8;
  undefined8 uStack_a4;
  char *local_98;
  char *sz;
  Element *elem_1;
  const_iterator __end7;
  const_iterator __begin7;
  ElementList *__range7;
  reference local_68;
  Element *elem;
  const_iterator __end6;
  const_iterator __begin6;
  ElementList *__range6;
  __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
  local_40;
  const_iterator iterEnd;
  __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
  local_30;
  const_iterator iter;
  SectionList *mSections_local;
  MD5CameraParser *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->cuts);
  std::vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>::
  vector(&this->frames);
  pLVar4 = DefaultLogger::get();
  Logger::debug(pLVar4,"MD5CameraParser begin");
  this->fFrameRate = 24.0;
  iterEnd._M_current =
       (Section *)
       std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::begin(mSections);
  __gnu_cxx::
  __normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
  ::__normal_iterator<Assimp::MD5::Section*>
            ((__normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
              *)&local_30,
             (__normal_iterator<Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
              *)&iterEnd);
  __range6 = (ElementList *)
             std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::end
                       (mSections);
  __gnu_cxx::
  __normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
  ::__normal_iterator<Assimp::MD5::Section*>
            ((__normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
              *)&local_40,
             (__normal_iterator<Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
              *)&__range6);
  while (bVar2 = __gnu_cxx::operator!=(&local_30,&local_40), bVar2) {
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
             ::operator*(&local_30);
    bVar2 = std::operator==(&pSVar5->mName,"numFrames");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
      ::operator*(&local_30);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      uVar3 = strtoul10(pcVar6,(char **)0x0);
      std::
      vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>::
      reserve(&this->frames,(ulong)uVar3);
    }
    else {
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
               ::operator*(&local_30);
      bVar2 = std::operator==(&pSVar5->mName,"frameRate");
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
        ::operator*(&local_30);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        aVar7 = fast_atof(pcVar6);
        this->fFrameRate = aVar7;
      }
      else {
        pSVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                 ::operator*(&local_30);
        bVar2 = std::operator==(&pSVar5->mName,"numCuts");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
          ::operator*(&local_30);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          uVar3 = strtoul10(pcVar6,(char **)0x0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                    (&this->cuts,(ulong)uVar3);
        }
        else {
          pSVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                   ::operator*(&local_30);
          bVar2 = std::operator==(&pSVar5->mName,"cuts");
          if (bVar2) {
            pSVar5 = __gnu_cxx::
                     __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                     ::operator*(&local_30);
            __end6 = std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::begin
                               (&pSVar5->mElements);
            elem = (Element *)
                   std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::end
                             (&pSVar5->mElements);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                                               *)&elem), bVar2) {
              local_68 = __gnu_cxx::
                         __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                         ::operator*(&__end6);
              uVar3 = strtoul10(local_68->szStart,(char **)0x0);
              __range7._4_4_ = uVar3 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&this->cuts,(value_type_conflict3 *)((long)&__range7 + 4));
              __gnu_cxx::
              __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
              ::operator++(&__end6);
            }
          }
          else {
            pSVar5 = __gnu_cxx::
                     __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                     ::operator*(&local_30);
            bVar2 = std::operator==(&pSVar5->mName,"camera");
            if (bVar2) {
              pSVar5 = __gnu_cxx::
                       __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                       ::operator*(&local_30);
              __end7 = std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::
                       begin(&pSVar5->mElements);
              elem_1 = (Element *)
                       std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::end
                                 (&pSVar5->mElements);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end7,(__normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                                                 *)&elem_1), bVar2) {
                sz = (char *)__gnu_cxx::
                             __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                             ::operator*(&__end7);
                local_98 = ((reference)sz)->szStart;
                fStack_a8 = 0.0;
                uStack_a4._0_4_ = 0.0;
                uStack_a4._4_4_ = 0.0;
                cur = (CameraAnimFrameDesc *)0x0;
                fStack_b0 = 0.0;
                local_ac = 0.0;
                CameraAnimFrameDesc::CameraAnimFrameDesc((CameraAnimFrameDesc *)&cur);
                std::
                vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                ::push_back(&this->frames,(CameraAnimFrameDesc *)&cur);
                out = std::
                      vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                      ::back(&this->frames);
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                pcVar6 = local_98 + 1;
                cVar1 = *local_98;
                local_98 = pcVar6;
                if (cVar1 != '(') {
                  MD5Parser::ReportWarning("Unexpected token: ( was expected",*(uint *)(sz + 8));
                }
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                local_98 = fast_atoreal_move<float>(local_98,(float *)out,true);
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                local_98 = fast_atoreal_move<float>
                                     (local_98,&(out->super_BaseFrameDesc).vPositionXYZ.y,true);
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                local_98 = fast_atoreal_move<float>
                                     (local_98,&(out->super_BaseFrameDesc).vPositionXYZ.z,true);
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                pcVar6 = local_98 + 1;
                cVar1 = *local_98;
                local_98 = pcVar6;
                if (cVar1 != ')') {
                  MD5Parser::ReportWarning("Unexpected token: ) was expected",*(uint *)(sz + 8));
                }
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                pcVar6 = local_98 + 1;
                cVar1 = *local_98;
                local_98 = pcVar6;
                if (cVar1 != '(') {
                  MD5Parser::ReportWarning("Unexpected token: ( was expected",*(uint *)(sz + 8));
                }
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                local_98 = fast_atoreal_move<float>
                                     (local_98,&(out->super_BaseFrameDesc).vRotationQuat.x,true);
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                local_98 = fast_atoreal_move<float>
                                     (local_98,&(out->super_BaseFrameDesc).vRotationQuat.y,true);
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                local_98 = fast_atoreal_move<float>
                                     (local_98,&(out->super_BaseFrameDesc).vRotationQuat.z,true);
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                pcVar6 = local_98 + 1;
                cVar1 = *local_98;
                local_98 = pcVar6;
                if (cVar1 != ')') {
                  MD5Parser::ReportWarning("Unexpected token: ) was expected",*(uint *)(sz + 8));
                }
                bVar2 = SkipSpaces<char>(&local_98);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz + 8));
                }
                aVar7 = fast_atof(local_98);
                out->fFOV = aVar7;
                __gnu_cxx::
                __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                ::operator++(&__end7);
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
    ::operator++(&local_30);
  }
  pLVar4 = DefaultLogger::get();
  Logger::debug(pLVar4,"MD5CameraParser end");
  return;
}

Assistant:

MD5CameraParser::MD5CameraParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5CameraParser begin");
    fFrameRate = 24.0f;

    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "numFrames")   {
            frames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "frameRate")  {
            fFrameRate = fast_atof ((*iter).mGlobalValue.c_str());
        }
        else if ((*iter).mName == "numCuts")    {
            cuts.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "cuts")   {
            for (const auto & elem : (*iter).mElements){
                cuts.push_back(strtoul10(elem.szStart)+1);
            }
        }
        else if ((*iter).mName == "camera") {
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                frames.push_back(CameraAnimFrameDesc());
                CameraAnimFrameDesc& cur = frames.back();
                AI_MD5_READ_TRIPLE(cur.vPositionXYZ);
                AI_MD5_READ_TRIPLE(cur.vRotationQuat);
                AI_MD5_SKIP_SPACES();
                cur.fFOV = fast_atof(sz);
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5CameraParser end");
}